

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int ARKodeGetNumGEvals(void *arkode_mem,long *ngevals)

{
  int line;
  
  if (arkode_mem == (void *)0x0) {
    arkode_mem = (ARKodeMem)0x0;
    line = 0xa25;
  }
  else {
    if (*(long *)((long)arkode_mem + 0x3d8) != 0) {
      *ngevals = *(long *)(*(long *)((long)arkode_mem + 0x3d8) + 0x68);
      return 0;
    }
    line = 0xa2c;
  }
  arkProcessError((ARKodeMem)arkode_mem,-0x15,line,"ARKodeGetNumGEvals",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                  ,"arkode_mem = NULL illegal.");
  return -0x15;
}

Assistant:

int ARKodeGetNumGEvals(void* arkode_mem, long int* ngevals)
{
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  if (ark_mem->root_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_root_mem = (ARKodeRootMem)ark_mem->root_mem;
  *ngevals     = ark_root_mem->nge;
  return (ARK_SUCCESS);
}